

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O0

void Abc_NtkFraigSweepUsingExdc(Fraig_Man_t *pMan,Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  int iVar2;
  Fraig_Node_t *pFVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Fraig_Node_t *pFVar6;
  int local_44;
  int i;
  Abc_Obj_t *pNodeAig;
  Abc_Obj_t *pNode;
  Fraig_Node_t *gNodeRes;
  Fraig_Node_t *gNode;
  Fraig_Node_t *gNodeExdc;
  Abc_Ntk_t *pNtk_local;
  Fraig_Man_t *pMan_local;
  
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    pFVar3 = Abc_NtkToFraigExdc(pMan,pNtk,pNtk->pExdc);
    for (local_44 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_44 < iVar2; local_44 = local_44 + 1)
    {
      pAVar4 = Abc_NtkObj(pNtk,local_44);
      if ((((pAVar4 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pAVar4), iVar2 != 0)) &&
          (iVar2 = Abc_ObjFaninNum(pAVar4), iVar2 != 0)) &&
         (pAVar4 = (pAVar4->field_6).pCopy, pAVar4 != (Abc_Obj_t *)0x0)) {
        pAVar5 = Abc_ObjRegular(pAVar4);
        pvVar1 = (pAVar5->field_6).pTemp;
        iVar2 = Abc_ObjIsComplement(pAVar4);
        pFVar6 = Fraig_NodeAnd(pMan,(Fraig_Node_t *)((ulong)pvVar1 ^ (long)iVar2),
                               (Fraig_Node_t *)((ulong)pFVar3 ^ 1));
        iVar2 = Abc_ObjIsComplement(pAVar4);
        pAVar4 = Abc_ObjRegular(pAVar4);
        (pAVar4->field_6).pTemp = (void *)((ulong)pFVar6 ^ (long)iVar2);
      }
    }
    return;
  }
  __assert_fail("pNtk->pExdc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSweep.c"
                ,0x9c,"void Abc_NtkFraigSweepUsingExdc(Fraig_Man_t *, Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkFraigSweepUsingExdc( Fraig_Man_t * pMan, Abc_Ntk_t * pNtk )
{
    Fraig_Node_t * gNodeExdc, * gNode, * gNodeRes;
    Abc_Obj_t * pNode, * pNodeAig;
    int i;
    extern Fraig_Node_t * Abc_NtkToFraigExdc( Fraig_Man_t * pMan, Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkExdc );

    assert( pNtk->pExdc );
    // derive FRAIG node representing don't-cares in the EXDC network
    gNodeExdc = Abc_NtkToFraigExdc( pMan, pNtk, pNtk->pExdc );
    // update the node pointers
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        // skip the constant input nodes
        if ( Abc_ObjFaninNum(pNode) == 0 )
            continue;
        // get the strashed node
        pNodeAig = pNode->pCopy;
        // skip the dangling nodes
        if ( pNodeAig == NULL )
            continue;
        // get the FRAIG node
        gNode = Fraig_NotCond( Abc_ObjRegular(pNodeAig)->pCopy, (int)Abc_ObjIsComplement(pNodeAig) );
        // perform ANDing with EXDC
        gNodeRes = Fraig_NodeAnd( pMan, gNode, Fraig_Not(gNodeExdc) );
        // write the node back
        Abc_ObjRegular(pNodeAig)->pCopy = (Abc_Obj_t *)Fraig_NotCond( gNodeRes, (int)Abc_ObjIsComplement(pNodeAig) );
    }
}